

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddInv.c
# Opt level: O2

DdNode * Cudd_addScalarInverse(DdManager *dd,DdNode *f,DdNode *epsilon)

{
  DdNode *pDVar1;
  
  if (epsilon->index == 0x7fffffff) {
    do {
      dd->reordered = 0;
      pDVar1 = cuddAddScalarInverseRecur(dd,f,epsilon);
    } while (dd->reordered == 1);
  }
  else {
    fwrite("Invalid epsilon\n",0x10,1,(FILE *)dd->err);
    pDVar1 = (DdNode *)0x0;
  }
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addScalarInverse(
  DdManager * dd,
  DdNode * f,
  DdNode * epsilon)
{
    DdNode *res;

    if (!cuddIsConstant(epsilon)) {
        (void) fprintf(dd->err,"Invalid epsilon\n");
        return(NULL);
    }
    do {
        dd->reordered = 0;
        res  = cuddAddScalarInverseRecur(dd,f,epsilon);
    } while (dd->reordered == 1);
    return(res);

}